

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode Curl_conn_tcp_accepted_set
                   (Curl_easy *data,connectdata *conn,int sockindex,curl_socket_t *s)

{
  curl_socket_t cVar1;
  uint err;
  Curl_cfilter *cf;
  void *pvVar2;
  void *pvVar3;
  _Bool _Var4;
  int iVar5;
  uint *puVar6;
  char *pcVar7;
  char *fmt;
  curltime cVar8;
  curl_socklen_t plen;
  Curl_sockaddr_storage ssrem;
  char buffer [256];
  socklen_t local_1bc;
  sockaddr local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  char local_138 [264];
  
  cf = conn->cfilter[sockindex];
  if (cf == (Curl_cfilter *)0x0) {
    return CURLE_FAILED_INIT;
  }
  if (cf->cft != &Curl_cft_tcp_accept) {
    return CURLE_FAILED_INIT;
  }
  pvVar2 = cf->ctx;
  socket_close(data,conn,1,*(curl_socket_t *)((long)pvVar2 + 0x98));
  cVar1 = *s;
  *(curl_socket_t *)((long)pvVar2 + 0x98) = cVar1;
  conn->sock[sockindex] = cVar1;
  pvVar3 = cf->ctx;
  *(undefined1 *)((long)pvVar3 + 0xe0) = 0;
  *(undefined4 *)((long)pvVar3 + 0x110) = 0;
  local_1bc = 0x80;
  local_1b8.sa_family = 0;
  local_1b8.sa_data[0] = '\0';
  local_1b8.sa_data[1] = '\0';
  local_1b8.sa_data[2] = '\0';
  local_1b8.sa_data[3] = '\0';
  local_1b8.sa_data[4] = '\0';
  local_1b8.sa_data[5] = '\0';
  local_1b8.sa_data[6] = '\0';
  local_1b8.sa_data[7] = '\0';
  local_1b8.sa_data[8] = '\0';
  local_1b8.sa_data[9] = '\0';
  local_1b8.sa_data[10] = '\0';
  local_1b8.sa_data[0xb] = '\0';
  local_1b8.sa_data[0xc] = '\0';
  local_1b8.sa_data[0xd] = '\0';
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_148 = 0;
  uStack_140 = 0;
  iVar5 = getpeername(*(int *)((long)pvVar3 + 0x98),&local_1b8,&local_1bc);
  if (iVar5 == 0) {
    _Var4 = Curl_addr2string((sockaddr *)&local_1b8,local_1bc,(char *)((long)pvVar3 + 0xe0),
                             (int *)((long)pvVar3 + 0x110));
    if (_Var4) goto LAB_006c57dc;
    fmt = "ssrem inet_ntop() failed with errno %d: %s";
  }
  else {
    fmt = "getpeername() failed with errno %d: %s";
  }
  puVar6 = (uint *)__errno_location();
  err = *puVar6;
  pcVar7 = Curl_strerror(err,local_138,0x100);
  Curl_failf(data,fmt,(ulong)err,pcVar7);
LAB_006c57dc:
  set_local_ip(cf,data);
  *(byte *)((long)pvVar2 + 0x17c) = *(byte *)((long)pvVar2 + 0x17c) | 10;
  cVar8 = Curl_now();
  *(time_t *)((long)pvVar2 + 0x158) = cVar8.tv_sec;
  *(int *)((long)pvVar2 + 0x160) = cVar8.tv_usec;
  cf->field_0x24 = cf->field_0x24 | 1;
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"accepted_set(sock=%d, remote=%s port=%d)",
                      (ulong)*(uint *)((long)pvVar2 + 0x98),(long)pvVar2 + 0xe0,
                      (ulong)*(uint *)((long)pvVar2 + 0x110));
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_conn_tcp_accepted_set(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex, curl_socket_t *s)
{
  struct Curl_cfilter *cf = NULL;
  struct cf_socket_ctx *ctx = NULL;

  cf = conn->cfilter[sockindex];
  if(!cf || cf->cft != &Curl_cft_tcp_accept)
    return CURLE_FAILED_INIT;

  ctx = cf->ctx;
  /* discard the listen socket */
  socket_close(data, conn, TRUE, ctx->sock);
  ctx->sock = *s;
  conn->sock[sockindex] = ctx->sock;
  set_accepted_remote_ip(cf, data);
  set_local_ip(cf, data);
  ctx->active = TRUE;
  ctx->accepted = TRUE;
  ctx->connected_at = Curl_now();
  cf->connected = TRUE;
  CURL_TRC_CF(data, cf, "accepted_set(sock=%" CURL_FORMAT_SOCKET_T
              ", remote=%s port=%d)",
              ctx->sock, ctx->r_ip, ctx->r_port);

  return CURLE_OK;
}